

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void scalar_inverse_ntt(scalar *s)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int local_30;
  int i_1;
  uint16_t even;
  uint16_t odd;
  int j;
  uint32_t step_root;
  int i;
  int k;
  int offset;
  int step;
  scalar *s_local;
  
  k = 0x80;
  for (i = 2; i < 0x100; i = i << 1) {
    k = k >> 1;
    step_root = 0;
    for (j = 0; j < k; j = j + 1) {
      uVar1 = kInverseNTTRoots[j + k];
      for (i_1 = step_root; i_1 < (int)(step_root + i); i_1 = i_1 + 1) {
        uVar2 = s->c[i_1 + i];
        uVar3 = s->c[i_1];
        uVar4 = reduce_once(uVar2 + uVar3);
        s->c[i_1] = uVar4;
        uVar4 = reduce((uint)uVar1 * (((uint)uVar3 - (uint)uVar2) + 0xd01));
        s->c[i_1 + i] = uVar4;
      }
      step_root = i * 2 + step_root;
    }
  }
  for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
    uVar4 = reduce((uint)s->c[local_30] * 0xce7);
    s->c[local_30] = uVar4;
  }
  return;
}

Assistant:

static void scalar_inverse_ntt(scalar *s) {
  int step = DEGREE / 2;
  // `int` is used here because using `size_t` throughout caused a ~5% slowdown
  // with Clang 14 on Aarch64.
  for (int offset = 2; offset < DEGREE; offset <<= 1) {
    step >>= 1;
    int k = 0;
    for (int i = 0; i < step; i++) {
      uint32_t step_root = kInverseNTTRoots[i + step];
      for (int j = k; j < k + offset; j++) {
        uint16_t odd = s->c[j + offset];
        uint16_t even = s->c[j];
        s->c[j] = reduce_once(odd + even);
        s->c[j + offset] = reduce(step_root * (even - odd + kPrime));
      }
      k += 2 * offset;
    }
  }
  for (int i = 0; i < DEGREE; i++) {
    s->c[i] = reduce(s->c[i] * kInverseDegree);
  }
}